

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SIMDPFor::__encodeArray
          (SIMDPFor *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference in_00;
  long lVar3;
  DATATYPE **ppDVar4;
  reference pvVar5;
  reference pvVar6;
  undefined4 *in_RCX;
  ulong in_RDX;
  size_type in_RDI;
  long *in_R8;
  size_t in_stack_00000020;
  DATATYPE *in_stack_00000028;
  uint32_t t;
  size_t howmanyexcept;
  uint32_t exceptindex;
  uint32_t firstexceptmask;
  uint32_t bitsforfirstexcept;
  uint32_t firstexcept;
  uint32_t *headerout;
  size_t k;
  uint32_t b;
  DATATYPE *i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> exceptions;
  uint32_t *initout;
  uint32_t in_stack_ffffffffffffff50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint local_94;
  DATATYPE **exceptions_00;
  ulong uVar7;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t uVar8;
  DATATYPE *pDVar9;
  SIMDPFor *in_stack_ffffffffffffffa8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined4 *local_30;
  undefined4 *puVar10;
  
  local_30 = in_RCX;
  checkifdivisibleby((size_t)in_RCX,(uint32_t)((ulong)in_R8 >> 0x20));
  this_00 = &local_48;
  puVar10 = local_30;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x14a160);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,in_RDI);
  in_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_48,0);
  uVar1 = determineBestBase(in_stack_00000028,in_stack_00000020);
  *puVar10 = (int)in_RDX;
  puVar10[1] = uVar1;
  uVar8 = uVar1;
  exceptions_00 = (DATATYPE **)(puVar10 + 2);
  for (uVar7 = 0; uVar7 < in_RDX >> 7; uVar7 = uVar7 + 1) {
    lVar3 = (long)exceptions_00 + 4;
    uVar2 = compressblockPFOR(in_stack_ffffffffffffffa8,in_00,
                              (uint32_t *)CONCAT44(uVar8,in_stack_ffffffffffffff98),
                              (uint32_t)(uVar7 >> 0x20),exceptions_00);
    ppDVar4 = (DATATYPE **)(lVar3 + (ulong)((uVar8 << 7) >> 5) * 4);
    in_stack_ffffffffffffff50 = uVar2;
    pDVar9 = in_00;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_48,0);
    *(uint32_t *)exceptions_00 = uVar2 & 0x7f | (int)((long)in_00 - (long)pvVar5 >> 2) << 7;
    in_00 = pDVar9;
    exceptions_00 = ppDVar4;
  }
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_48,0);
  for (local_94 = 0; (ulong)local_94 < (ulong)((long)in_00 - (long)pvVar5 >> 2);
      local_94 = local_94 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_48,(ulong)local_94);
    *(value_type *)exceptions_00 = *pvVar6;
    exceptions_00 = (DATATYPE **)((long)exceptions_00 + 4);
  }
  *in_R8 = (long)exceptions_00 - (long)local_30 >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t len, uint32_t *out,
                     size_t &nvalue) {
    checkifdivisibleby(len, BlockSize);
    const uint32_t *const initout(out);
    std::vector<DATATYPE> exceptions;
    exceptions.resize(len);
    DATATYPE *__restrict__ i = &exceptions[0];
    const uint32_t b = determineBestBase(in, len);
    *out++ = static_cast<uint32_t>(len);
    *out++ = b;
    for (size_t k = 0; k < len / BlockSize; ++k) {
      uint32_t *const headerout(out);
      ++out;
      uint32_t firstexcept = compressblockPFOR(in, out, b, i);
      out += (BlockSize * b) / 32;
      in += BlockSize;
      const uint32_t bitsforfirstexcept = blocksizeinbits;
      const uint32_t firstexceptmask = (1U << blocksizeinbits) - 1;
      const uint32_t exceptindex = static_cast<uint32_t>(i - &exceptions[0]);
      *headerout =
          (firstexcept & firstexceptmask) | (exceptindex << bitsforfirstexcept);
    }
    const size_t howmanyexcept = i - &exceptions[0];
    for (uint32_t t = 0; t < howmanyexcept; ++t)
      *out++ = exceptions[t];
    nvalue = out - initout;
  }